

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * QtPrivate::argToQString(QAnyStringView pattern,size_t numArgs,ArgBase **args)

{
  QAnyStringView s;
  ulong uVar1;
  size_type sVar2;
  qsizetype size;
  QVarLengthArray<(anonymous_namespace)::Part,_32LL> *this;
  iterator pPVar3;
  iterator pPVar4;
  const_iterator pQVar5;
  ulong in_RCX;
  __off_t __length;
  QAnyStringView *in_RDI;
  long in_FS_OFFSET;
  Part *part;
  iterator __end1;
  iterator __begin1;
  ParseResult *__range1;
  QChar *out;
  qsizetype totalSize;
  QString *result;
  ArgIndexToPlaceholderMap argIndexToPlaceholderMap;
  ParseResult parts;
  char *in_stack_fffffffffffffb68;
  QVarLengthArray<int,_16LL> *in_stack_fffffffffffffb70;
  char *in_stack_fffffffffffffb78;
  QMessageLogger *in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb88;
  Initialization in_stack_fffffffffffffb8c;
  QString *in_stack_fffffffffffffb98;
  QAnyStringView *this_00;
  ParseResult *in_stack_fffffffffffffbc8;
  ArgBase **in_stack_fffffffffffffbd8;
  ArgIndexToPlaceholderMap *in_stack_fffffffffffffbe0;
  ParseResult *in_stack_fffffffffffffbe8;
  int local_3e8;
  QString local_3d0;
  QMessageLogger local_3b8;
  QVLABaseBase local_378;
  undefined1 *puStack_360;
  undefined1 *local_358;
  undefined1 *puStack_350;
  undefined1 *local_348;
  undefined1 *puStack_340;
  undefined1 *local_338;
  undefined1 *puStack_330;
  undefined1 *local_328;
  undefined1 local_320 [792];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  memset(local_320,0xaa,0x318);
  s.m_size._0_4_ = in_stack_fffffffffffffb88;
  s.field_0.m_data = in_stack_fffffffffffffb80;
  s.m_size._4_4_ = in_stack_fffffffffffffb8c;
  anon_unknown.dwarf_ab58a6::parseMultiArgFormatString(s);
  local_328 = &DAT_aaaaaaaaaaaaaaaa;
  local_338 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_330 = &DAT_aaaaaaaaaaaaaaaa;
  local_348 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_340 = &DAT_aaaaaaaaaaaaaaaa;
  local_358 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_350 = &DAT_aaaaaaaaaaaaaaaa;
  local_378.ptr = &DAT_aaaaaaaaaaaaaaaa;
  puStack_360 = &DAT_aaaaaaaaaaaaaaaa;
  local_378.a = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_378.s = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  anon_unknown.dwarf_ab58a6::makeArgIndexToPlaceholderMap(in_stack_fffffffffffffbc8);
  uVar1 = QVLABaseBase::size(&local_378);
  if (in_RCX < uVar1) {
    QVarLengthArray<int,_16LL>::resize
              (in_stack_fffffffffffffb70,(qsizetype)in_stack_fffffffffffffb68);
  }
  else {
    uVar1 = QVLABaseBase::size(&local_378);
    if (uVar1 < in_RCX) {
      QMessageLogger::QMessageLogger
                (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                 (int)((ulong)in_stack_fffffffffffffb70 >> 0x20),in_stack_fffffffffffffb68);
      local_3e8 = (int)in_RCX;
      sVar2 = QVLABaseBase::size(&local_378);
      QAnyStringView::toString((QAnyStringView *)in_stack_fffffffffffffb70);
      asString(&local_3d0);
      in_stack_fffffffffffffb98 = (QString *)QString::utf16((QString *)in_stack_fffffffffffffb70);
      QMessageLogger::warning
                (&local_3b8,"QString::arg: %d argument(s) missing in %ls",
                 (ulong)(uint)(local_3e8 - (int)sVar2),in_stack_fffffffffffffb98);
      QString::~QString((QString *)0x51d153);
    }
  }
  size = anon_unknown.dwarf_ab58a6::resolveStringRefsAndReturnTotalSize
                   (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  in_RDI[1].field_0.m_data = (QChar *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->field_0).m_data = (QChar *)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI->m_size = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString(in_stack_fffffffffffffb98,size,in_stack_fffffffffffffb8c);
  this = (QVarLengthArray<(anonymous_namespace)::Part,_32LL> *)
         QString::constData((QString *)0x51d1f2);
  pPVar3 = QVLABase<(anonymous_namespace)::Part>::begin
                     ((QVLABase<(anonymous_namespace)::Part> *)0x51d22c);
  pPVar4 = QVLABase<(anonymous_namespace)::Part>::end
                     ((QVLABase<(anonymous_namespace)::Part> *)in_stack_fffffffffffffb70);
  for (; pPVar3 != pPVar4; pPVar3 = pPVar3 + 1) {
    this = (QVarLengthArray<(anonymous_namespace)::Part,_32LL> *)
           QAnyStringView::
           visit<QtPrivate::argToQString(QAnyStringView,unsigned_long,QtPrivate::ArgBase_const**)::Concatenate>
                     (this_00,(Concatenate *)in_RDI);
  }
  pQVar5 = QString::cbegin((QString *)0x51d2ed);
  QString::truncate((QString *)in_RDI,(char *)((long)this - (long)pQVar5 >> 1),__length);
  QVarLengthArray<int,_16LL>::~QVarLengthArray((QVarLengthArray<int,_16LL> *)this);
  QVarLengthArray<(anonymous_namespace)::Part,_32LL>::~QVarLengthArray(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QString QtPrivate::argToQString(QAnyStringView pattern, size_t numArgs, const ArgBase **args)
{
    // Step 1-2 above
    ParseResult parts = parseMultiArgFormatString(pattern);

    // 3-4
    ArgIndexToPlaceholderMap argIndexToPlaceholderMap = makeArgIndexToPlaceholderMap(parts);

    if (static_cast<size_t>(argIndexToPlaceholderMap.size()) > numArgs) // 3a
        argIndexToPlaceholderMap.resize(qsizetype(numArgs));
    else if (Q_UNLIKELY(static_cast<size_t>(argIndexToPlaceholderMap.size()) < numArgs)) // 3b
        qWarning("QString::arg: %d argument(s) missing in %ls",
                 int(numArgs - argIndexToPlaceholderMap.size()), qUtf16Printable(pattern.toString()));

    // 5
    const qsizetype totalSize = resolveStringRefsAndReturnTotalSize(parts, argIndexToPlaceholderMap, args);

    // 6:
    QString result(totalSize, Qt::Uninitialized);
    auto out = const_cast<QChar*>(result.constData());

    struct Concatenate {
        QChar *out;
        QChar *operator()(QLatin1String part) noexcept
        {
            if (part.size()) {
                qt_from_latin1(reinterpret_cast<char16_t*>(out),
                               part.data(), part.size());
            }
            return out + part.size();
        }
        QChar *operator()(QUtf8StringView part) noexcept
        {
            return QUtf8::convertToUnicode(out, part);
        }
        QChar *operator()(QStringView part) noexcept
        {
            if (part.size())
                memcpy(out, part.data(), part.size() * sizeof(QChar));
            return out + part.size();
        }
    };

    for (const Part &part : parts)
        out = part.string.visit(Concatenate{out});

    // UTF-8 decoding may have caused an overestimate of totalSize - correct it:
    result.truncate(out - result.cbegin());

    return result;
}